

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall google::protobuf::compiler::CodeGeneratorRequest::Clear(CodeGeneratorRequest *this)

{
  string *psVar1;
  undefined8 *puVar2;
  long lVar3;
  
  if (((this->_has_bits_[0] & 2) != 0) &&
     (psVar1 = this->parameter_, psVar1 != (string *)internal::kEmptyString_abi_cxx11_)) {
    psVar1->_M_string_length = 0;
    *(psVar1->_M_dataplus)._M_p = '\0';
  }
  if (0 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      puVar2 = (undefined8 *)(this->file_to_generate_).super_RepeatedPtrFieldBase.elements_[lVar3];
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_ = 0;
  if (0 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      (**(code **)(*(this->proto_file_).super_RepeatedPtrFieldBase.elements_[lVar3] + 0x20))();
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->proto_file_).super_RepeatedPtrFieldBase.current_size_);
  }
  (this->proto_file_).super_RepeatedPtrFieldBase.current_size_ = 0;
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void CodeGeneratorRequest::Clear() {
  if (_has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (has_parameter()) {
      if (parameter_ != &::google::protobuf::internal::kEmptyString) {
        parameter_->clear();
      }
    }
  }
  file_to_generate_.Clear();
  proto_file_.Clear();
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}